

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

QSize __thiscall QToolBoxButton::minimumSizeHint(QToolBoxButton *this)

{
  char cVar1;
  int iVar2;
  QStyle *pQVar3;
  QSize QVar4;
  long in_FS_OFFSET;
  QIcon QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractButton::icon((QAbstractButton *)&QStack_28);
  cVar1 = QIcon::isNull();
  QIcon::~QIcon(&QStack_28);
  QVar4.wd.m_i = -1;
  QVar4.ht.m_i = -1;
  if (cVar1 == '\0') {
    pQVar3 = QWidget::style((QWidget *)this);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))
                      (pQVar3,0x3e,0,
                       *(undefined8 *)
                        (*(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8 + 0x10));
    QVar4.ht.m_i = iVar2 + 8;
    QVar4.wd.m_i = iVar2 + 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBoxButton::minimumSizeHint() const
{
    if (icon().isNull())
        return QSize();
    int icone = style()->pixelMetric(QStyle::PM_SmallIconSize, nullptr, parentWidget() /* QToolBox */);
    return QSize(icone + 8, icone + 8);
}